

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTable::selectedRowCount(QAccessibleTable *this)

{
  QItemSelectionModel *pQVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_24;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f36aa);
  pQVar1 = QAbstractItemView::selectionModel
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (pQVar1 == (QItemSelectionModel *)0x0) {
    local_24 = 0;
  }
  else {
    view((QAccessibleTable *)0x7f36cc);
    QAbstractItemView::selectionModel
              ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QItemSelectionModel::selectedRows((int)&local_20);
    qVar2 = QList<QModelIndex>::size(&local_20);
    local_24 = (int)qVar2;
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7f36fb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::selectedRowCount() const
{
    if (!view()->selectionModel())
        return 0;
    return view()->selectionModel()->selectedRows().size();
}